

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack9(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  if (0x1f < bs + 0x1f) {
    auVar3 = vpmovsxbd_avx(ZEXT416(0x7030804));
    auVar8 = vpmovsxwd_avx(ZEXT816(0x18001f8010001f0));
    auVar16 = vpmovsxbd_avx512f(_DAT_0018db80);
    auVar17 = vpmovsxbd_avx512f(_DAT_0018db90);
    auVar18 = vbroadcasti64x4_avx512f(_DAT_0018d760);
    auVar19 = vpbroadcastd_avx512f(ZEXT416(0x1ff));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x1010606));
    auVar9 = vpmovsxwd_avx(ZEXT816(0x1fe01fe01c001c0));
    auVar5 = vpmovsxbd_avx(ZEXT416(0x4010101));
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x1f08111a030c151e));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x1b040d16));
    auVar7 = vpmovsxbd_avx(ZEXT416(0x912));
    uVar12 = bs + 0x1f >> 5;
    do {
      auVar15 = *(undefined1 (*) [16])in;
      *out = *(uint *)*(undefined1 (*) [16])in >> 0x17;
      uVar1 = *(uint *)*(undefined1 (*) [16])((long)in + 0x10);
      auVar13 = vpsllvd_avx2(auVar15,auVar3);
      auVar13 = vpand_avx(auVar13,auVar8);
      auVar20 = vpermd_avx512f(auVar18,ZEXT1664(auVar13));
      auVar21 = vpbroadcastd_avx512f();
      auVar21 = vpermt2d_avx512f(ZEXT1664(auVar15),auVar16,auVar21);
      auVar21 = vpsrlvd_avx512f(auVar21,auVar17);
      auVar22 = vpandd_avx512f(auVar21,auVar19);
      auVar20 = vpord_avx512f(auVar21,auVar20);
      auVar21._0_8_ = auVar22._0_8_;
      auVar21._8_4_ = auVar20._8_4_;
      auVar21._12_4_ = auVar22._12_4_;
      auVar21._16_4_ = auVar22._16_4_;
      auVar21._20_4_ = auVar22._20_4_;
      auVar21._24_4_ = auVar20._24_4_;
      auVar21._28_4_ = auVar22._28_4_;
      auVar21._32_4_ = auVar22._32_4_;
      auVar21._36_4_ = auVar20._36_4_;
      auVar21._40_4_ = auVar22._40_4_;
      auVar21._44_4_ = auVar22._44_4_;
      auVar21._48_4_ = auVar22._48_4_;
      auVar21._52_4_ = auVar20._52_4_;
      auVar21._56_4_ = auVar22._56_4_;
      auVar21._60_4_ = auVar22._60_4_;
      uVar2 = *(ulong *)(*(undefined1 (*) [16])((long)in + 0x10) + 0xc);
      auVar13 = vpbroadcastq_avx512vl();
      in = (uint32_t *)(*(undefined1 (*) [16])((long)in + 0x20) + 4);
      auVar20 = vmovdqu64_avx512f(auVar21);
      *(undefined1 (*) [64])(out + 1) = auVar20;
      auVar15 = vpsllvd_avx2(auVar13,auVar4);
      auVar15 = vpand_avx(auVar15,auVar9);
      auVar23._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * ZEXT416((uVar1 & 0x7f) << 2);
      auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar2;
      auVar13 = vpermt2d_avx512vl(auVar13,auVar5,auVar15);
      auVar15 = vpshufd_avx(auVar15,0x40);
      auVar14 = vpbroadcastd_avx512vl();
      auVar11 = vpsrlvd_avx2(auVar15,auVar6);
      auVar24._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar14;
      auVar24._16_16_ = ZEXT116(1) * auVar13;
      auVar24 = vpsrlvd_avx2(auVar24,auVar10);
      auVar23 = vpor_avx2(auVar24,auVar23);
      auVar24 = vpand_avx2(auVar24,auVar19._0_32_);
      auVar24 = vpblendd_avx2(auVar24,auVar23,0x91);
      auVar14 = auVar19._0_16_;
      auVar15 = vpand_avx(auVar11,auVar14);
      *(undefined1 (*) [32])(out + 0x11) = auVar24;
      auVar13 = vpinsrd_avx(auVar14,((uint)uVar2 & 0xf) << 5,3);
      auVar13 = vpor_avx(auVar11,auVar13);
      auVar15 = vpblendd_avx2(auVar15,auVar13,8);
      *(undefined1 (*) [16])(out + 0x19) = auVar15;
      auVar15 = vpbroadcastd_avx512vl();
      auVar15 = vpsrlvd_avx2(auVar15,auVar7);
      auVar15 = vpand_avx(auVar15,auVar14);
      *(long *)(out + 0x1d) = auVar15._0_8_;
      out[0x1f] = (uint)(uVar2 >> 0x20) & 0x1ff;
      out = out + 0x20;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack9(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 9, --bs) {
    out[0] = in[0] >> 23;
    out[1] = (in[0] >> 14) & 0x01ff;
    out[2] = (in[0] >> 5) & 0x01ff;
    out[3] = (in[0] << 4) & 0x01ff;
    out[3] |= in[1] >> 28;
    out[4] = (in[1] >> 19) & 0x01ff;
    out[5] = (in[1] >> 10) & 0x01ff;
    out[6] = (in[1] >> 1) & 0x01ff;
    out[7] = (in[1] << 8) & 0x01ff;
    out[7] |= in[2] >> 24;
    out[8] = (in[2] >> 15) & 0x01ff;
    out[9] = (in[2] >> 6) & 0x01ff;
    out[10] = (in[2] << 3) & 0x01ff;
    out[10] |= in[3] >> 29;
    out[11] = (in[3] >> 20) & 0x01ff;
    out[12] = (in[3] >> 11) & 0x01ff;
    out[13] = (in[3] >> 2) & 0x01ff;
    out[14] = (in[3] << 7) & 0x01ff;
    out[14] |= in[4] >> 25;
    out[15] = (in[4] >> 16) & 0x01ff;
    out[16] = (in[4] >> 7) & 0x01ff;
    out[17] = (in[4] << 2) & 0x01ff;
    out[17] |= in[5] >> 30;
    out[18] = (in[5] >> 21) & 0x01ff;
    out[19] = (in[5] >> 12) & 0x01ff;
    out[20] = (in[5] >> 3) & 0x01ff;
    out[21] = (in[5] << 6) & 0x01ff;
    out[21] |= in[6] >> 26;
    out[22] = (in[6] >> 17) & 0x01ff;
    out[23] = (in[6] >> 8) & 0x01ff;
    out[24] = (in[6] << 1) & 0x01ff;
    out[24] |= in[7] >> 31;
    out[25] = (in[7] >> 22) & 0x01ff;
    out[26] = (in[7] >> 13) & 0x01ff;
    out[27] = (in[7] >> 4) & 0x01ff;
    out[28] = (in[7] << 5) & 0x01ff;
    out[28] |= in[8] >> 27;
    out[29] = (in[8] >> 18) & 0x01ff;
    out[30] = (in[8] >> 9) & 0x01ff;
    out[31] = in[8] & 0x01ff;
  }
}